

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O1

void Wln_RetInsertOneFanin(Wln_Ret_t *p,int iObj,int iFlop)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  Wln_Ntk_t *pWVar5;
  Wln_Vec_t *pWVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  if (-1 < iObj) {
    iVar1 = (p->vFanins).nSize;
    if (iObj < iVar1) {
      piVar3 = (p->vFanins).pArray;
      lVar9 = (long)piVar3[(uint)iObj];
      if ((lVar9 < 0) || (iVar1 <= piVar3[(uint)iObj])) {
LAB_00364664:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      if ((-1 < iFlop) && (iFlop < (p->pNtk->vTypes).nSize)) {
        if ((p->pNtk->vTypes).pArray[(uint)iFlop] != 0x59) {
          __assert_fail("Wln_ObjIsFf( p->pNtk, iFlop )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                        ,0x1cd,"void Wln_RetInsertOneFanin(Wln_Ret_t *, int, int)");
        }
        pWVar5 = p->pNtk;
        pWVar6 = pWVar5->vFanins;
        if (0 < pWVar6[(uint)iObj].nSize) {
          lVar8 = 0;
          do {
            iVar1 = (p->vFanins).nSize;
            if (iVar1 <= iObj) goto LAB_00364645;
            piVar4 = (p->vFanins).pArray;
            iVar2 = piVar4[(uint)iObj];
            if (((long)iVar2 < 0) || (iVar1 <= iVar2)) goto LAB_00364664;
            iVar1 = piVar4[(long)iVar2 + lVar8 * 2];
            lVar7 = (long)iVar1;
            if (lVar7 != 0) {
              if (pWVar6[lVar7].nSize == 0) {
                if ((iVar1 < 0) || ((pWVar5->vTypes).nSize <= iVar1)) goto LAB_00364645;
                if ((pWVar5->vTypes).pArray[lVar7] != 3) goto LAB_0036461e;
              }
              if ((pWVar5->vTypes).nSize <= iObj) goto LAB_00364645;
              if ((lVar8 == 0) || ((pWVar5->vTypes).pArray[(uint)iObj] != 0x59)) {
                iVar1 = piVar3[lVar9 + lVar8 * 2 + 1];
                piVar3[lVar9 + lVar8 * 2 + 1] = (p->vEdgeLinks).nSize;
                Vec_IntPush(&p->vEdgeLinks,iVar1);
                Vec_IntPush(&p->vEdgeLinks,iFlop);
              }
            }
LAB_0036461e:
            lVar8 = lVar8 + 1;
            pWVar5 = p->pNtk;
            pWVar6 = pWVar5->vFanins;
          } while (lVar8 < pWVar6[(uint)iObj].nSize);
        }
        return;
      }
    }
  }
LAB_00364645:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Wln_RetInsertOneFanin( Wln_Ret_t * p, int iObj, int iFlop )
{
    int k, iHead, iFanin, * pLink;
    int * pFanins  = Wln_RetFanins( p, iObj );
    assert( Wln_ObjIsFf( p->pNtk, iFlop ) );
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
    {
        if ( Wln_ObjIsFf(p->pNtk, iObj) && k > 0 )
            continue;
        iHead = pFanins[2*k+1];
        pFanins[2*k+1] = Vec_IntSize(&p->vEdgeLinks);
        Vec_IntPushTwo( &p->vEdgeLinks, iHead, iFlop );
    }
}